

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall libcellml::Units::addUnit(Units *this,string *reference,double exponent,string *id)

{
  allocator<char> local_49;
  double local_48;
  string local_40;
  
  local_48 = exponent;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"0",&local_49);
  addUnit(this,reference,&local_40,local_48,1.0,id);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Units::addUnit(const std::string &reference, double exponent, const std::string &id)
{
    addUnit(reference, "0", exponent, 1.0, id);
}